

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

bool f8n::env::CopyFile(string *from,string *to)

{
  bool bVar1;
  char cVar2;
  ofstream out;
  ifstream in;
  streambuf local_208 [504];
  
  if (((from->_M_string_length != 0) && (to->_M_string_length != 0)) &&
     (bVar1 = std::operator!=(from,to), bVar1)) {
    std::ifstream::ifstream(&in,(string *)from,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      std::ofstream::ofstream(&out,(string *)to,_S_out);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::ostream::operator<<((ostream *)&out,local_208);
        std::ofstream::~ofstream(&out);
        std::ifstream::~ifstream(&in);
        return true;
      }
      std::ofstream::~ofstream(&out);
    }
    std::ifstream::~ifstream(&in);
  }
  return false;
}

Assistant:

bool CopyFile(const std::string& from, const std::string& to) {
        if (from.size() && to.size() && from != to) {
            std::ifstream in(from);
            if (in.is_open()) {
                std::ofstream out(to);
                if (out.is_open()) {
                    out << in.rdbuf();
                    return true;
                }
            }
        }
        return false;
    }